

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLock::Update(ChLinkLock *this,double time,bool update_assets)

{
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x46])();
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4c])(this);
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4e])(this);
  UpdateCqw(this);
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4d])(time,this);
  ChPhysicsItem::Update
            ((ChPhysicsItem *)this,
             (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
             super_ChObj.ChTime,update_assets);
  return;
}

Assistant:

void ChLinkLock::Update(double time, bool update_assets) {
    UpdateTime(time);
    UpdateRelMarkerCoords();
    UpdateState();
    UpdateCqw();
    UpdateForces(time);

    // Update assets
    ChPhysicsItem::Update(ChTime, update_assets);
}